

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlBinary.cpp
# Opt level: O1

void __thiscall libebml::EbmlBinary::EbmlBinary(EbmlBinary *this,EbmlBinary *ElementToClone)

{
  size_t __size;
  binary *__dest;
  
  EbmlElement::EbmlElement(&this->super_EbmlElement,&ElementToClone->super_EbmlElement);
  (this->super_EbmlElement)._vptr_EbmlElement = (_func_int **)&PTR__EbmlBinary_001ce0e8;
  if (ElementToClone->Data == (binary *)0x0) {
    this->Data = (binary *)0x0;
    return;
  }
  __size = (this->super_EbmlElement).Size;
  __dest = (binary *)malloc(__size);
  this->Data = __dest;
  if (__dest != (binary *)0x0) {
    memcpy(__dest,ElementToClone->Data,__size);
    return;
  }
  __assert_fail("Data != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlBinary.cpp"
                ,0x38,"libebml::EbmlBinary::EbmlBinary(const EbmlBinary &)");
}

Assistant:

EbmlBinary::EbmlBinary(const EbmlBinary & ElementToClone)
  :EbmlElement(ElementToClone)
{
  if (ElementToClone.Data == NULL)
    Data = NULL;
  else {
    Data = (binary *)malloc(GetSize() * sizeof(binary));
    assert(Data != NULL);
    memcpy(Data, ElementToClone.Data, GetSize());
  }
}